

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::TestFieldOrderings::_InternalSerialize
          (TestFieldOrderings *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  float fVar1;
  uint uVar2;
  WireFormatLite *this_00;
  ulong uVar3;
  TestFieldOrderings_NestedMessage *value;
  undefined8 *puVar4;
  uint8_t *puVar5;
  EpsCopyOutputStream *in_R9;
  string_view s;
  string_view field_name;
  
  uVar2 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar2 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.my_int_,target);
  }
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    in_R9 = stream;
    target = google::protobuf::internal::ExtensionSet::_InternalSerializeImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_TestFieldOrderings_default_instance_,2,0xb,target,stream);
  }
  if ((uVar2 & 1) != 0) {
    puVar4 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.my_string_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    this_00 = (WireFormatLite *)*puVar4;
    uVar3 = puVar4[1];
    field_name._M_str = (char *)in_R9;
    field_name._M_len = (size_t)"edition_unittest.TestFieldOrderings.my_string";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (this_00,(char *)(uVar3 & 0xffffffff),1,0x2d,field_name);
    s._M_str = (char *)this_00;
    s._M_len = uVar3;
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,0xb,s,target)
    ;
  }
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = google::protobuf::internal::ExtensionSet::_InternalSerializeImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_TestFieldOrderings_default_instance_,0xc,0x65,target,stream)
    ;
  }
  if ((uVar2 & 8) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    fVar1 = (this->field_0)._impl_.my_float_;
    target[0] = 0xad;
    target[1] = '\x06';
    *(float *)(target + 2) = fVar1;
    target = target + 6;
  }
  if ((uVar2 & 2) != 0) {
    value = (this->field_0)._impl_.optional_nested_message_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (200,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return target;
  }
  puVar5 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar5;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestFieldOrderings::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestFieldOrderings& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestFieldOrderings)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int64 my_int = 1;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>(
            stream, this_._internal_my_int(), target);
  }

  // Extension range [2, 11)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 2, 11, target, stream);
  // string my_string = 11;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::absl::string_view _s = this_._internal_my_string();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestFieldOrderings.my_string");
    target = stream->WriteStringMaybeAliased(11, _s, target);
  }

  // Extension range [12, 101)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 12, 101, target, stream);
  // float my_float = 101;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFloatToArray(
        101, this_._internal_my_float(), target);
  }

  // .edition_unittest.TestFieldOrderings.NestedMessage optional_nested_message = 200;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        200, *this_._impl_.optional_nested_message_, this_._impl_.optional_nested_message_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestFieldOrderings)
  return target;
}